

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O3

void uprv_free_63(void *buffer)

{
  if ((int32_t *)buffer == zeroMem) {
    return;
  }
  if (pFree != (UMemFreeFn *)0x0) {
    (*pFree)(pContext,buffer);
    return;
  }
  free(buffer);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_free(void *buffer) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
  putchar('<');
  fflush(stdout);
#endif
    if (buffer != zeroMem) {
        if (pFree) {
            (*pFree)(pContext, buffer);
        } else {
            uprv_default_free(buffer);
        }
    }
}